

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O1

void cs_debugger_func_callback(string *decl,statement_base *stmt)

{
  element_type *peVar1;
  ulong uVar2;
  string *psVar3;
  size_t sVar4;
  ostream *poVar5;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>::iterator,_bool>
  pStack_38;
  
  peVar1 = ((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar3 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
  sVar4 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
                      *)&peVar1->csyms,psVar3);
  if (sVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nHit breakpoint, at \"",0x15);
    psVar3 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\", line ",8);
  }
  else {
    peVar1 = ((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar3 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
    phmap::priv::
    raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
    ::try_emplace_impl<std::__cxx11::string_const&>(&pStack_38,&peVar1->csyms,psVar3);
    if ((ulong)(*(long *)((long)pStack_38.first.field_1.slot_ + 0x48) -
                *(long *)((long)pStack_38.first.field_1.slot_ + 0x40) >> 3) <= stmt->line_num) {
      return;
    }
    uVar2 = *(ulong *)(*(long *)((long)pStack_38.first.field_1.slot_ + 0x40) + -8 +
                      stmt->line_num * 8);
    if (uVar2 == 0) {
      return;
    }
    if ((ulong)(*(long *)((long)pStack_38.first.field_1.slot_ + 0x60) -
                *(long *)((long)pStack_38.first.field_1.slot_ + 0x58) >> 5) <= uVar2) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nHit breakpoint, at \"",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)((long)pStack_38.first.field_1.slot_ + 0x20)
                        ,*(long *)((long)pStack_38.first.field_1.slot_ + 0x28));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\", line ",8);
  }
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(decl->_M_dataplus)._M_p,decl->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  current_level = *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3
  ;
  exec_by_step = true;
  return;
}

Assistant:

void cs_debugger_func_callback(const std::string &decl, cs::statement_base *stmt)
{
	if (context->compiler->csyms.count(stmt->get_file_path()) > 0) {
		cs::csym_info &csym = context->compiler->csyms[stmt->get_file_path()];
		std::size_t current_line = stmt->get_line_num();
		if (current_line >= csym.map.size())
			return;
		std::size_t actual_line = csym.map[current_line - 1];
		if (actual_line >= csym.codes.size() || actual_line == 0)
			return;
		std::cout << "\nHit breakpoint, at \"" << csym.file << "\", line " << actual_line << ", " << decl << std::endl;
	}
	else
		std::cout << "\nHit breakpoint, at \"" << stmt->get_file_path() << "\", line " << stmt->get_line_num() << ", " << decl << std::endl;
	current_level = cs::current_process->stack.size();
	exec_by_step = true;
}